

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixLock(unqlite_file *id,int eFileLock)

{
  byte bVar1;
  uint uVar2;
  unqlite_io_methods *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  unixFile *pFile;
  char cVar9;
  flock lock;
  undefined2 local_48;
  undefined2 local_46;
  undefined8 local_40;
  undefined8 local_38;
  
  bVar1 = *(byte *)&id[3].pMethods;
  if (eFileLock <= (int)(uint)bVar1) {
    return 0;
  }
  puVar3 = id[1].pMethods;
  uVar2 = *(uint *)((long)&puVar3->xRead + 4);
  if (uVar2 == bVar1) {
    if (eFileLock == 1) goto LAB_0010fc0b;
    local_38 = 1;
    local_46 = 0;
    if (eFileLock == 4) {
      local_48 = 1;
      if (bVar1 < 3) goto LAB_0010fc38;
LAB_0010fc6c:
      iVar5 = -0xe;
      if (*(int *)&puVar3->xRead < 2) {
        local_40 = 0x40000002;
        local_38 = 0x1fe;
        goto LAB_0010fcab;
      }
    }
    else {
LAB_0010fc67:
      if (eFileLock == 4) goto LAB_0010fc6c;
      if (eFileLock == 2) {
        local_40 = 0x40000001;
      }
LAB_0010fcab:
      local_48 = 1;
      iVar5 = 6;
      iVar4 = fcntl(*(int *)&id[2].pMethods,6,&local_48);
      if (iVar4 != -1) {
LAB_0010fcc6:
        *(char *)&id[3].pMethods = (char)eFileLock;
        *(int *)((long)&puVar3->xRead + 4) = eFileLock;
        goto LAB_0010fccf;
      }
      piVar8 = __errno_location();
      iVar4 = *piVar8;
      iVar5 = unqliteErrorFromPosixError(iVar4,iVar5);
      if ((iVar5 == 0) || (iVar5 == -0xe)) {
LAB_0010fd71:
        if (iVar5 == 0) goto LAB_0010fcc6;
      }
      else {
LAB_0010fda4:
        *(int *)((long)&id[3].pMethods + 4) = iVar4;
      }
      if (eFileLock != 4) {
        return iVar5;
      }
    }
    *(undefined1 *)&id[3].pMethods = 3;
    *(undefined4 *)((long)&puVar3->xRead + 4) = 3;
  }
  else {
    if (1 < (uint)eFileLock || 2 < (int)uVar2) {
      return -0xe;
    }
LAB_0010fc0b:
    if (1 < uVar2 - 1) {
      local_48 = 0;
LAB_0010fc38:
      local_38 = 1;
      local_46 = 0;
      cVar9 = (char)local_48;
      local_40 = 0x40000000;
      iVar5 = 6;
      iVar4 = fcntl(*(int *)&id[2].pMethods,6);
      if (iVar4 == -1) {
LAB_0010fd3c:
        piVar8 = __errno_location();
        iVar4 = *piVar8;
        iVar5 = unqliteErrorFromPosixError(iVar4,iVar5);
        if (iVar5 == -0xe) {
          return -0xe;
        }
        if (iVar5 == 0) {
          return 0;
        }
        *(int *)((long)&id[3].pMethods + 4) = iVar4;
        return iVar5;
      }
      if (cVar9 != '\0') goto LAB_0010fc67;
      local_40 = 0x40000002;
      local_38 = 0x1fe;
      iVar4 = 0;
      iVar6 = fcntl(*(int *)&id[2].pMethods,6);
      if (iVar6 == -1) {
        piVar8 = __errno_location();
        iVar4 = *piVar8;
      }
      local_40 = 0x40000000;
      local_38 = 1;
      local_48 = 2;
      iVar5 = 6;
      iVar7 = fcntl(*(int *)&id[2].pMethods,6);
      if ((iVar6 != -1) && (iVar7 != 0)) goto LAB_0010fd3c;
      if (iVar6 == -1) {
        iVar5 = unqliteErrorFromPosixError(iVar4,iVar5);
        if ((iVar5 == -0xe) || (iVar5 == 0)) goto LAB_0010fd71;
        goto LAB_0010fda4;
      }
      piVar8 = (int *)((long)&puVar3->xWrite + 4);
      *piVar8 = *piVar8 + 1;
      *(undefined4 *)&puVar3->xRead = 1;
      goto LAB_0010fcc6;
    }
    *(undefined1 *)&id[3].pMethods = 1;
    *(int *)&puVar3->xRead = *(int *)&puVar3->xRead + 1;
    piVar8 = (int *)((long)&puVar3->xWrite + 4);
    *piVar8 = *piVar8 + 1;
LAB_0010fccf:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int unixLock(unqlite_file *id, int eFileLock){
  /* The following describes the implementation of the various locks and
  ** lock transitions in terms of the POSIX advisory shared and exclusive
  ** lock primitives (called read-locks and write-locks below, to avoid
  ** confusion with SQLite lock names). The algorithms are complicated
  ** slightly in order to be compatible with unixdows systems simultaneously
  ** accessing the same database file, in case that is ever required.
  **
  ** Symbols defined in os.h indentify the 'pending byte' and the 'reserved
  ** byte', each single bytes at well known offsets, and the 'shared byte
  ** range', a range of 510 bytes at a well known offset.
  **
  ** To obtain a SHARED lock, a read-lock is obtained on the 'pending
  ** byte'.  If this is successful, a random byte from the 'shared byte
  ** range' is read-locked and the lock on the 'pending byte' released.
  **
  ** A process may only obtain a RESERVED lock after it has a SHARED lock.
  ** A RESERVED lock is implemented by grabbing a write-lock on the
  ** 'reserved byte'. 
  **
  ** A process may only obtain a PENDING lock after it has obtained a
  ** SHARED lock. A PENDING lock is implemented by obtaining a write-lock
  ** on the 'pending byte'. This ensures that no new SHARED locks can be
  ** obtained, but existing SHARED locks are allowed to persist. A process
  ** does not have to obtain a RESERVED lock on the way to a PENDING lock.
  ** This property is used by the algorithm for rolling back a journal file
  ** after a crash.
  **
  ** An EXCLUSIVE lock, obtained after a PENDING lock is held, is
  ** implemented by obtaining a write-lock on the entire 'shared byte
  ** range'. Since all other locks require a read-lock on one of the bytes
  ** within this range, this ensures that no other locks are held on the
  ** database. 
  **
  ** The reason a single byte cannot be used instead of the 'shared byte
  ** range' is that some versions of unixdows do not support read-locks. By
  ** locking a random byte from a range, concurrent SHARED locks may exist
  ** even if the locking primitive used is always a write-lock.
  */
  int rc = UNQLITE_OK;
  unixFile *pFile = (unixFile*)id;
  unixInodeInfo *pInode = pFile->pInode;
  struct flock lock;
  int s = 0;
  int tErrno = 0;

  /* If there is already a lock of this type or more restrictive on the
  ** unixFile, do nothing. Don't use the end_lock: exit path, as
  ** unixEnterMutex() hasn't been called yet.
  */
  if( pFile->eFileLock>=eFileLock ){
    return UNQLITE_OK;
  }
  /* This mutex is needed because pFile->pInode is shared across threads
  */
  unixEnterMutex();
  pInode = pFile->pInode;

  /* If some thread using this PID has a lock via a different unixFile*
  ** handle that precludes the requested lock, return BUSY.
  */
  if( (pFile->eFileLock!=pInode->eFileLock && 
          (pInode->eFileLock>=PENDING_LOCK || eFileLock>SHARED_LOCK))
  ){
    rc = UNQLITE_BUSY;
    goto end_lock;
  }

  /* If a SHARED lock is requested, and some thread using this PID already
  ** has a SHARED or RESERVED lock, then increment reference counts and
  ** return UNQLITE_OK.
  */
  if( eFileLock==SHARED_LOCK && 
      (pInode->eFileLock==SHARED_LOCK || pInode->eFileLock==RESERVED_LOCK) ){
    pFile->eFileLock = SHARED_LOCK;
    pInode->nShared++;
    pInode->nLock++;
    goto end_lock;
  }
  /* A PENDING lock is needed before acquiring a SHARED lock and before
  ** acquiring an EXCLUSIVE lock.  For the SHARED lock, the PENDING will
  ** be released.
  */
  lock.l_len = 1L;
  lock.l_whence = SEEK_SET;
  if( eFileLock==SHARED_LOCK 
      || (eFileLock==EXCLUSIVE_LOCK && pFile->eFileLock<PENDING_LOCK)
  ){
    lock.l_type = (eFileLock==SHARED_LOCK?F_RDLCK:F_WRLCK);
    lock.l_start = PENDING_BYTE;
    s = fcntl(pFile->h, F_SETLK, &lock);
    if( s==(-1) ){
      tErrno = errno;
      rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
      if( IS_LOCK_ERROR(rc) ){
        pFile->lastErrno = tErrno;
      }
      goto end_lock;
    }
  }
  /* If control gets to this point, then actually go ahead and make
  ** operating system calls for the specified lock.
  */
  if( eFileLock==SHARED_LOCK ){
    /* Now get the read-lock */
    lock.l_start = SHARED_FIRST;
    lock.l_len = SHARED_SIZE;
    if( (s = fcntl(pFile->h, F_SETLK, &lock))==(-1) ){
      tErrno = errno;
    }
    /* Drop the temporary PENDING lock */
    lock.l_start = PENDING_BYTE;
    lock.l_len = 1L;
    lock.l_type = F_UNLCK;
    if( fcntl(pFile->h, F_SETLK, &lock)!=0 ){
      if( s != -1 ){
        /* This could happen with a network mount */
        tErrno = errno; 
        rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR); 
        if( IS_LOCK_ERROR(rc) ){
          pFile->lastErrno = tErrno;
        }
        goto end_lock;
      }
    }
    if( s==(-1) ){
		rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
      if( IS_LOCK_ERROR(rc) ){
        pFile->lastErrno = tErrno;
      }
    }else{
      pFile->eFileLock = SHARED_LOCK;
      pInode->nLock++;
      pInode->nShared = 1;
    }
  }else if( eFileLock==EXCLUSIVE_LOCK && pInode->nShared>1 ){
    /* We are trying for an exclusive lock but another thread in this
    ** same process is still holding a shared lock. */
    rc = UNQLITE_BUSY;
  }else{
    /* The request was for a RESERVED or EXCLUSIVE lock.  It is
    ** assumed that there is a SHARED or greater lock on the file
    ** already.
    */
    lock.l_type = F_WRLCK;
    switch( eFileLock ){
      case RESERVED_LOCK:
        lock.l_start = RESERVED_BYTE;
        break;
      case EXCLUSIVE_LOCK:
        lock.l_start = SHARED_FIRST;
        lock.l_len = SHARED_SIZE;
        break;
      default:
		  /* Can't happen */
        break;
    }
    s = fcntl(pFile->h, F_SETLK, &lock);
    if( s==(-1) ){
      tErrno = errno;
      rc = unqliteErrorFromPosixError(tErrno, UNQLITE_LOCKERR);
      if( IS_LOCK_ERROR(rc) ){
        pFile->lastErrno = tErrno;
      }
    }
  }
  if( rc==UNQLITE_OK ){
    pFile->eFileLock = eFileLock;
    pInode->eFileLock = eFileLock;
  }else if( eFileLock==EXCLUSIVE_LOCK ){
    pFile->eFileLock = PENDING_LOCK;
    pInode->eFileLock = PENDING_LOCK;
  }
end_lock:
  unixLeaveMutex();
  return rc;
}